

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.hpp
# Opt level: O0

void __thiscall Diligent::StringPool::AssignMemory(StringPool *this,Char *pBuffer,size_t Size)

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  size_t Size_local;
  Char *pBuffer_local;
  StringPool *this_local;
  
  msg.field_2._8_8_ = Size;
  if (this->m_ReservedSize != 0) {
    FormatString<char[28]>((string *)local_40,(char (*) [28])"Pool is already initialized");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"AssignMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringPool.hpp"
               ,0x6e);
    std::__cxx11::string::~string((string *)local_40);
  }
  this->m_ReservedSize = msg.field_2._8_8_;
  this->m_pBuffer = pBuffer;
  this->m_pCurrPtr = this->m_pBuffer;
  return;
}

Assistant:

void AssignMemory(Char* pBuffer, size_t Size)
    {
        VERIFY(m_ReservedSize == 0, "Pool is already initialized");
        m_ReservedSize = Size;
        m_pBuffer      = pBuffer;
        m_pCurrPtr     = m_pBuffer;
    }